

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

CameraSample *
pbrt::GetCameraSample<pbrt::SobolSampler>(SobolSampler sampler,Point2i pPixel,Filter *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  BasicPBRTOptions *pBVar2;
  SobolSampler *in_RDX;
  CameraSample *in_RDI;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined1 auVar10 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  FilterSample FVar11;
  CameraSample *cs;
  FilterSample fs;
  CameraSample *pCVar12;
  Tuple2<pbrt::Point2,_float> TVar13;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff88;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff90;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  TVar13 = (Tuple2<pbrt::Point2,_float>)&stack0x00000008;
  pCVar12 = in_RDI;
  auVar4._0_8_ = SobolSampler::GetPixel2D(in_stack_ffffffffffffff88);
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  auVar10 = ZEXT856(0);
  FVar11 = Filter::Sample((Filter *)in_stack_ffffffffffffff88,(Point2f)in_stack_ffffffffffffff90);
  auVar5._0_8_ = FVar11.p.super_Tuple2<pbrt::Point2,_float>;
  auVar5._8_56_ = auVar10;
  vmovlpd_avx(auVar5._0_16_);
  CameraSample::CameraSample((CameraSample *)in_RDX);
  auVar6._0_8_ = Tuple2<pbrt::Point2,int>::operator+((Tuple2<pbrt::Point2,_int> *)in_RDX,TVar13);
  auVar6._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar6._0_16_);
  Vector2<float>::Vector2((Vector2<float> *)in_RDX,(float)((ulong)pCVar12 >> 0x20),SUB84(pCVar12,0))
  ;
  auVar7._0_8_ = Point2<float>::operator+((Point2<float> *)in_RDX,TVar13);
  auVar7._8_56_ = extraout_var_01;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7._0_16_);
  (in_RDI->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar3 = SobolSampler::Get1D(in_RDX);
  in_RDI->time = FVar3;
  auVar8._0_8_ = SobolSampler::Get2D(TVar13);
  auVar8._8_56_ = extraout_var_02;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar8._0_16_);
  (in_RDI->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  in_RDI->filterWeight = FVar11.weight;
  pBVar2 = GetOptions();
  if ((pBVar2->disablePixelJitter & 1U) != 0) {
    Vector2<float>::Vector2
              ((Vector2<float> *)in_RDX,(float)((ulong)pCVar12 >> 0x20),SUB84(pCVar12,0));
    auVar9._0_8_ = Point2<int>::operator+((Point2<int> *)in_RDX,TVar13);
    auVar9._8_56_ = extraout_var_03;
    TVar13 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
    (in_RDI->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar13;
    in_RDI->time = 0.5;
    Point2<float>::Point2((Point2<float> *)in_RDX,(float)((ulong)pCVar12 >> 0x20),SUB84(pCVar12,0));
    (in_RDI->pLens).super_Tuple2<pbrt::Point2,_float> = in_stack_ffffffffffffff88;
    in_RDI->filterWeight = 1.0;
  }
  return pCVar12;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(S sampler, Point2i pPixel,
                                                 Filter filter) {
    FilterSample fs = filter.Sample(sampler.GetPixel2D());
    CameraSample cs;
    // Initialize _CameraSample_ member variables
    cs.pFilm = pPixel + fs.p + Vector2f(0.5f, 0.5f);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.filterWeight = fs.weight;

    if (GetOptions().disablePixelJitter) {
        cs.pFilm = pPixel + Vector2f(0.5f, 0.5f);
        cs.time = 0.5f;
        cs.pLens = Point2f(0.5f, 0.5f);
        cs.filterWeight = 1;
    }
    return cs;
}